

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O0

void __thiscall BamTools::SplitTool::~SplitTool(SplitTool *this)

{
  void *in_RDI;
  SplitTool *unaff_retaddr;
  
  ~SplitTool(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

SplitTool::~SplitTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}